

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O3

void __thiscall HevcVpsUnit::setFPS(HevcVpsUnit *this,double fps)

{
  uint uVar1;
  long lVar2;
  
  lVar2 = lround(fps);
  uVar1 = (int)lVar2 * 1000000;
  this->time_scale = uVar1;
  lVar2 = lround((double)uVar1 / fps);
  this->num_units_in_tick = (uint)lVar2;
  if (0 < this->num_units_in_tick_bit_pos) {
    HevcUnit::updateBits((HevcUnit *)this,this->num_units_in_tick_bit_pos,0x20,(uint)lVar2);
    HevcUnit::updateBits
              ((HevcUnit *)this,this->num_units_in_tick_bit_pos + 0x20,0x20,this->time_scale);
    return;
  }
  __assert_fail("num_units_in_tick_bit_pos > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/hevc.cpp"
                ,0xea,"void HevcVpsUnit::setFPS(const double)");
}

Assistant:

void HevcVpsUnit::setFPS(const double fps)
{
    time_scale = lround(fps) * 1000000;
    num_units_in_tick = lround(time_scale / fps);

    assert(num_units_in_tick_bit_pos > 0);
    updateBits(num_units_in_tick_bit_pos, 32, num_units_in_tick);
    updateBits(num_units_in_tick_bit_pos + 32, 32, time_scale);
}